

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinType
          (Interpreter *this,LocationRange *param_1,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  Type TVar1;
  anon_union_8_3_4e909c26_for_v aVar2;
  Value VVar3;
  UString *local_30 [2];
  _Alloc_hider local_20;
  
  TVar1 = ((args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start)->t;
  if ((int)TVar1 < 0x10) {
    if (TVar1 == NULL_TYPE) {
      local_30[0] = (UString *)&local_20;
      std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_30,L"null",L"");
      VVar3 = makeString(this,local_30[0]);
      aVar2 = VVar3._0_8_;
    }
    else if (TVar1 == BOOLEAN) {
      local_30[0] = (UString *)&local_20;
      std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_30,L"boolean",L"");
      VVar3 = makeString(this,local_30[0]);
      aVar2 = VVar3._0_8_;
    }
    else {
      if (TVar1 != NUMBER) {
        return (AST *)0x0;
      }
      local_30[0] = (UString *)&local_20;
      std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_30,L"number",L"");
      VVar3 = makeString(this,local_30[0]);
      aVar2 = VVar3._0_8_;
    }
  }
  else {
    switch(TVar1) {
    case ARRAY:
      local_30[0] = (UString *)&local_20;
      std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_30,L"array",L"");
      VVar3 = makeString(this,local_30[0]);
      aVar2 = VVar3._0_8_;
      break;
    case FUNCTION:
      local_30[0] = (UString *)&local_20;
      std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_30,L"function",L"");
      VVar3 = makeString(this,local_30[0]);
      aVar2 = VVar3._0_8_;
      break;
    case OBJECT:
      local_30[0] = (UString *)&local_20;
      std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_30,L"object",L"");
      VVar3 = makeString(this,local_30[0]);
      aVar2 = VVar3._0_8_;
      break;
    case STRING:
      local_30[0] = (UString *)&local_20;
      std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_30,L"string",L"");
      VVar3 = makeString(this,local_30[0]);
      aVar2 = VVar3._0_8_;
      break;
    default:
      goto switchD_00194cfc_default;
    }
  }
  (this->scratch).t = STRING;
  (this->scratch).v = aVar2;
  if (local_30[0] != (UString *)&local_20) {
    operator_delete(local_30[0],(long)local_20._M_p * 4 + 4);
  }
switchD_00194cfc_default:
  return (AST *)0x0;
}

Assistant:

const AST *builtinType(const LocationRange &, const std::vector<Value> &args)
    {
        switch (args[0].t) {
            case Value::NULL_TYPE: scratch = makeString(U"null"); return nullptr;

            case Value::BOOLEAN: scratch = makeString(U"boolean"); return nullptr;

            case Value::NUMBER: scratch = makeString(U"number"); return nullptr;

            case Value::ARRAY: scratch = makeString(U"array"); return nullptr;

            case Value::FUNCTION: scratch = makeString(U"function"); return nullptr;

            case Value::OBJECT: scratch = makeString(U"object"); return nullptr;

            case Value::STRING: scratch = makeString(U"string"); return nullptr;
        }
        return nullptr;  // Quiet, compiler.
    }